

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,true,false>
               (unsigned_long *ldata,unsigned_long *rdata,unsigned_long *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long lentry;
  ulong uVar8;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar2 = *ldata;
      iVar5 = 0;
      do {
        uVar6 = uVar2 >> ((byte)rdata[iVar5] & 0x3f);
        if (0x3f < rdata[iVar5]) {
          uVar6 = 0;
        }
        result_data[iVar5] = uVar6;
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar6 = 0;
    uVar2 = 0;
    do {
      uVar7 = puVar1[uVar6];
      uVar8 = uVar2 + 0x40;
      if (count <= uVar2 + 0x40) {
        uVar8 = count;
      }
      uVar3 = uVar8;
      if (uVar7 != 0) {
        uVar3 = uVar2;
        if (uVar7 == 0xffffffffffffffff) {
          if (uVar2 < uVar8) {
            uVar2 = *ldata;
            do {
              uVar7 = uVar2 >> ((byte)rdata[uVar3] & 0x3f);
              if (0x3f < rdata[uVar3]) {
                uVar7 = 0;
              }
              result_data[uVar3] = uVar7;
              uVar3 = uVar3 + 1;
            } while (uVar8 != uVar3);
          }
        }
        else if (uVar2 < uVar8) {
          uVar3 = 0;
          do {
            if ((uVar7 >> (uVar3 & 0x3f) & 1) != 0) {
              uVar4 = *ldata >> ((byte)rdata[uVar2 + uVar3] & 0x3f);
              if (0x3f < rdata[uVar2 + uVar3]) {
                uVar4 = 0;
              }
              result_data[uVar2 + uVar3] = uVar4;
            }
            uVar3 = uVar3 + 1;
          } while ((uVar2 - uVar8) + uVar3 != 0);
          uVar3 = uVar2 + uVar3;
        }
      }
      uVar6 = uVar6 + 1;
      uVar2 = uVar3;
    } while (uVar6 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}